

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_dce.cpp
# Opt level: O1

void __thiscall
spvtools::opt::VectorDCE::MarkVectorShuffleUsesAsLive
          (VectorDCE *this,WorkListItem *current_item,LiveComponentMap *live_components,
          vector<spvtools::opt::VectorDCE::WorkListItem,_std::allocator<spvtools::opt::VectorDCE::WorkListItem>_>
          *work_list)

{
  IRContext *this_00;
  DefUseManager *this_01;
  pointer puVar1;
  vector<spvtools::opt::VectorDCE::WorkListItem,_std::allocator<spvtools::opt::VectorDCE::WorkListItem>_>
  *work_list_00;
  uint32_t uVar2;
  uint32_t uVar3;
  uint uVar4;
  Instruction *pIVar5;
  ulong uVar6;
  uint uVar7;
  Instruction *this_02;
  BitVector *this_03;
  VectorDCE *pVVar8;
  WorkListItem second_operand;
  WorkListItem first_operand;
  BitVector BStack_b0;
  Instruction *local_98;
  BitVector BStack_90;
  vector<spvtools::opt::VectorDCE::WorkListItem,_std::allocator<spvtools::opt::VectorDCE::WorkListItem>_>
  *local_78;
  undefined1 local_70 [24];
  pointer local_58;
  undefined1 local_50 [24];
  pointer local_38;
  
  this_00 = (this->super_MemPass).super_Pass.context_;
  local_78 = work_list;
  if ((this_00->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
    IRContext::BuildDefUseManager(this_00);
  }
  this_01 = (this_00->def_use_mgr_)._M_t.
            super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
            ._M_t.
            super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
            .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>._M_head_impl;
  BStack_90.bits_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  BStack_90.bits_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_98 = (Instruction *)0x0;
  BStack_90.bits_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  BStack_90.bits_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)operator_new(8);
  BStack_90.bits_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish =
       BStack_90.bits_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start + 1;
  uVar3 = 0;
  *BStack_90.bits_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
   super__Vector_impl_data._M_start = 0;
  pIVar5 = current_item->instruction;
  uVar2 = (pIVar5->has_result_id_ & 1) + 1;
  if (pIVar5->has_type_id_ == false) {
    uVar2 = (uint)pIVar5->has_result_id_;
  }
  BStack_90.bits_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       BStack_90.bits_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_finish;
  uVar2 = Instruction::GetSingleWordOperand(pIVar5,uVar2);
  local_98 = analysis::DefUseManager::GetDef(this_01,uVar2);
  BStack_b0.bits_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  BStack_b0.bits_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  BStack_b0.bits_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  BStack_b0.bits_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)operator_new(8);
  BStack_b0.bits_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish =
       BStack_b0.bits_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start + 1;
  *BStack_b0.bits_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
   super__Vector_impl_data._M_start = 0;
  pIVar5 = current_item->instruction;
  uVar4 = (pIVar5->has_result_id_ & 1) + 1;
  if (pIVar5->has_type_id_ == false) {
    uVar4 = (uint)pIVar5->has_result_id_;
  }
  BStack_b0.bits_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       BStack_b0.bits_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_finish;
  uVar2 = Instruction::GetSingleWordOperand(pIVar5,uVar4 + 1);
  pIVar5 = analysis::DefUseManager::GetDef(this_01,uVar2);
  uVar2 = 0;
  if (local_98->has_type_id_ == true) {
    uVar2 = Instruction::GetSingleWordOperand(local_98,0);
  }
  uVar2 = GetVectorComponentCount(this,uVar2);
  if (pIVar5->has_type_id_ == true) {
    uVar3 = Instruction::GetSingleWordOperand(pIVar5,0);
  }
  uVar3 = GetVectorComponentCount(this,uVar3);
  this_02 = current_item->instruction;
  uVar4 = (this_02->has_result_id_ & 1) + 1;
  if (this_02->has_type_id_ == false) {
    uVar4 = (uint)this_02->has_result_id_;
  }
  if (2 < (int)((ulong)((long)(this_02->operands_).
                              super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(this_02->operands_).
                             super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 4) * -0x55555555 - uVar4)
  {
    uVar7 = 2;
    do {
      uVar4 = Instruction::GetSingleWordOperand(this_02,uVar4 + uVar7);
      uVar6 = (ulong)(uVar7 - 2 >> 6);
      puVar1 = (current_item->components).bits_.
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start;
      if ((uVar6 < (ulong)((long)(current_item->components).bits_.
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_finish - (long)puVar1 >> 3)) &&
         ((puVar1[uVar6] >> ((ulong)(uVar7 - 2) & 0x3f) & 1) != 0)) {
        this_03 = &BStack_90;
        if (uVar2 <= uVar4) {
          if (uVar3 <= uVar4 - uVar2) goto LAB_001b7c04;
          this_03 = &BStack_b0;
          uVar4 = uVar4 - uVar2;
        }
        utils::BitVector::Set(this_03,uVar4);
      }
LAB_001b7c04:
      uVar7 = uVar7 + 1;
      this_02 = current_item->instruction;
      uVar4 = (this_02->has_result_id_ & 1) + 1;
      if (this_02->has_type_id_ == false) {
        uVar4 = (uint)this_02->has_result_id_;
      }
    } while (uVar7 < (int)((ulong)((long)(this_02->operands_).
                                         super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)(this_02->operands_).
                                        super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                        ._M_impl.super__Vector_impl_data._M_start) >> 4) *
                     -0x55555555 - uVar4);
  }
  pVVar8 = (VectorDCE *)(local_50 + 8);
  local_50._0_8_ = local_98;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)pVVar8,&BStack_90.bits_);
  work_list_00 = local_78;
  AddItemToWorkListIfNeeded(pVVar8,(WorkListItem *)local_50,live_components,local_78);
  if ((pointer)local_50._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_50._8_8_,(long)local_38 - local_50._8_8_);
  }
  pVVar8 = (VectorDCE *)(local_70 + 8);
  local_70._0_8_ = pIVar5;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)pVVar8,&BStack_b0.bits_);
  AddItemToWorkListIfNeeded(pVVar8,(WorkListItem *)local_70,live_components,work_list_00);
  if ((pointer)local_70._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_70._8_8_,(long)local_58 - local_70._8_8_);
  }
  if (BStack_b0.bits_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(BStack_b0.bits_.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)BStack_b0.bits_.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)BStack_b0.bits_.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (BStack_90.bits_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(BStack_90.bits_.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)BStack_90.bits_.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)BStack_90.bits_.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void VectorDCE::MarkVectorShuffleUsesAsLive(
    const WorkListItem& current_item,
    VectorDCE::LiveComponentMap* live_components,
    std::vector<WorkListItem>* work_list) {
  analysis::DefUseManager* def_use_mgr = context()->get_def_use_mgr();

  WorkListItem first_operand;
  first_operand.instruction =
      def_use_mgr->GetDef(current_item.instruction->GetSingleWordInOperand(0));
  WorkListItem second_operand;
  second_operand.instruction =
      def_use_mgr->GetDef(current_item.instruction->GetSingleWordInOperand(1));

  uint32_t size_of_first_operand =
      GetVectorComponentCount(first_operand.instruction->type_id());
  uint32_t size_of_second_operand =
      GetVectorComponentCount(second_operand.instruction->type_id());

  for (uint32_t in_op = 2; in_op < current_item.instruction->NumInOperands();
       ++in_op) {
    uint32_t index = current_item.instruction->GetSingleWordInOperand(in_op);
    if (current_item.components.Get(in_op - 2)) {
      if (index < size_of_first_operand) {
        first_operand.components.Set(index);
      } else if (index - size_of_first_operand < size_of_second_operand) {
        second_operand.components.Set(index - size_of_first_operand);
      }
    }
  }

  AddItemToWorkListIfNeeded(first_operand, live_components, work_list);
  AddItemToWorkListIfNeeded(second_operand, live_components, work_list);
}